

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAddBuffsInt(Abc_Ntk_t *pNtkInit,int fReverse,int nImprove,int fVerbose)

{
  uint *puVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  int *piVar4;
  Abc_Obj_t *pFanin;
  uint nLevelMax;
  int iVar5;
  int iVar6;
  uint uVar7;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Abc_Obj_t *pFaninNew;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  uint local_7c;
  uint local_64;
  
  pNtk = Abc_NtkDup(pNtkInit);
  nLevelMax = Abc_NtkLevel(pNtk);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      *(uint *)((long)pVVar8->pArray[lVar12] + 0x14) =
           *(uint *)((long)pVVar8->pArray[lVar12] + 0x14) & 0xfff | nLevelMax * 0x1000 + 0x1000;
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = Abc_NtkDfs(pNtk,1);
  if (fReverse == 0) {
    if (0 < nImprove) {
      iVar6 = 0;
      do {
        uVar15 = 0;
        local_64 = 0;
        if (0 < (long)pVVar8->nSize) {
          local_64 = 0;
          uVar15 = 0;
          lVar12 = (long)pVVar8->nSize;
          do {
            if (pVVar8->nSize < lVar12) goto LAB_0086f7c3;
            pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar12 + -1];
            uVar7 = *(uint *)&pAVar3->field_0x14;
            uVar16 = uVar7 >> 0xc;
            if (nLevelMax < uVar16) {
              __assert_fail("pObj->Level <= (unsigned)nLevelMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                            ,0x969,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            uVar9 = (ulong)(pAVar3->vFanouts).nSize;
            bVar20 = 0 < (long)uVar9;
            if (0 < (long)uVar9) {
              uVar13 = 1;
              do {
                uVar17 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanouts).pArray[uVar13 - 1]] + 0x14) >> 0xc;
                if (uVar17 <= uVar16) {
                  __assert_fail("pFanin->Level > pObj->Level",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                                ,0x96c,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
                }
                if (uVar17 == uVar16 + 1) {
                  if (bVar20) goto LAB_0086f5c2;
                  break;
                }
                bVar20 = uVar13 < uVar9;
                bVar21 = uVar13 != uVar9;
                uVar13 = uVar13 + 1;
              } while (bVar21);
            }
            lVar19 = (long)(pAVar3->vFanins).nSize;
            if (lVar19 < 1) {
              iVar18 = 1;
            }
            else {
              piVar4 = (pAVar3->vFanins).pArray;
              ppvVar10 = pAVar3->pNtk->vObjs->pArray;
              iVar18 = 1;
              lVar14 = 0;
              do {
                uVar16 = Abc_NtkAddBuffsEval2(pAVar3,(Abc_Obj_t *)ppvVar10[piVar4[lVar14]]);
                iVar18 = iVar18 - (uVar16 ^ 1);
                lVar14 = lVar14 + 1;
              } while (lVar19 != lVar14);
            }
            if (-1 < iVar18) {
              *(uint *)&pAVar3->field_0x14 = uVar7 + 0x1000;
              uVar15 = uVar15 + 1;
              local_64 = local_64 + iVar18;
            }
LAB_0086f5c2:
            bVar20 = 1 < lVar12;
            lVar12 = lVar12 + -1;
          } while (bVar20);
        }
        if (fVerbose != 0) {
          printf("Shifted %5d nodes up with total gain %5d.\n",(ulong)uVar15,(ulong)local_64);
        }
      } while ((uVar15 != 0) && (iVar6 = iVar6 + 1, iVar6 != nImprove));
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (void **)0x0;
    }
  }
  else {
    if (0x3ffff < (int)nLevelMax) {
      __assert_fail("nLevelMax < (1<<18)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0x934,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
    }
    uVar9 = (ulong)(uint)pVVar8->nSize;
    while (0 < (int)uVar9) {
      if (pVVar8->nSize < (int)uVar9) {
LAB_0086f7c3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)pVVar8->pArray[uVar9 - 1];
      *(uint *)((long)plVar2 + 0x14) = *(uint *)((long)plVar2 + 0x14) & 0xfff | 0x40000000;
      if (0 < *(int *)((long)plVar2 + 0x2c)) {
        uVar15 = *(uint *)((long)plVar2 + 0x14);
        lVar12 = 0;
        do {
          uVar16 = (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)(plVar2[6] + lVar12 * 4) * 8) + 0x14) >> 0xc) -
                   1;
          uVar7 = uVar15 >> 0xc;
          if ((int)uVar16 < (int)(uVar15 >> 0xc)) {
            uVar7 = uVar16;
          }
          uVar15 = uVar15 & 0xfff | uVar7 << 0xc;
          *(uint *)((long)plVar2 + 0x14) = uVar15;
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)plVar2 + 0x2c));
      }
      uVar9 = uVar9 - 1;
      if (*(uint *)((long)plVar2 + 0x14) < 0x1000) {
        __assert_fail("pObj->Level > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0x93a,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
      }
    }
    pVVar11 = pNtk->vCis;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        puVar1 = (uint *)((long)pVVar11->pArray[lVar12] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar12 < pVVar11->nSize);
    }
    if (0 < nImprove) {
      iVar6 = 0;
      do {
        uVar15 = 0;
        local_7c = 0;
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          local_7c = 0;
          uVar15 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
            uVar7 = *(uint *)&pAVar3->field_0x14;
            if (uVar7 < 0x1000) {
              __assert_fail("pObj->Level > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                            ,0x946,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            iVar18 = (pAVar3->vFanins).nSize;
            uVar9 = (ulong)iVar18;
            bVar20 = 0 < (long)uVar9;
            if (0 < (long)uVar9) {
              uVar13 = 1;
              do {
                uVar16 = *(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanins).pArray[uVar13 - 1]] + 0x14) >> 0xc;
                if (uVar7 >> 0xc <= uVar16) {
                  __assert_fail("pFanin->Level < pObj->Level",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                                ,0x949,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
                }
                if (uVar16 + 1 == uVar7 >> 0xc) {
                  if (bVar20) goto LAB_0086f3a2;
                  break;
                }
                bVar20 = uVar13 < uVar9;
                bVar21 = uVar13 != uVar9;
                uVar13 = uVar13 + 1;
              } while (bVar21);
            }
            if (iVar18 < 1) {
              iVar18 = -1;
            }
            else {
              piVar4 = (pAVar3->vFanins).pArray;
              ppvVar10 = pAVar3->pNtk->vObjs->pArray;
              iVar18 = -1;
              uVar13 = 0;
              do {
                iVar5 = Abc_NtkAddBuffsEval(pAVar3,(Abc_Obj_t *)ppvVar10[piVar4[uVar13]]);
                iVar18 = iVar18 + iVar5;
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
            }
            if (-1 < iVar18) {
              *(uint *)&pAVar3->field_0x14 = uVar7 - 0x1000;
              uVar15 = uVar15 + 1;
              local_7c = local_7c + iVar18;
            }
LAB_0086f3a2:
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar8->nSize);
        }
        if (fVerbose != 0) {
          printf("Shifted %5d nodes down with total gain %5d.\n",(ulong)uVar15,(ulong)local_7c);
        }
      } while ((uVar15 != 0) && (iVar6 = iVar6 + 1, iVar6 != nImprove));
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (void **)0x0;
    }
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  uVar15 = pNtk->vObjs->nSize;
  iVar18 = (nLevelMax + 1) * uVar15;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar18 - 1U) {
    iVar6 = iVar18;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar8->pArray = ppvVar10;
  pVVar8->nSize = iVar18;
  memset(ppvVar10,0,(long)iVar18 << 3);
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    uVar9 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar11->pArray[uVar9];
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        if (uVar9 == uVar15) break;
        uVar7 = *(uint *)&pAVar3->field_0x14 & 0xf;
        if (((uVar7 < 8) && ((0x98U >> uVar7 & 1) != 0)) && (0 < (pAVar3->vFanins).nSize)) {
          lVar12 = 0;
          do {
            pFanin = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar12]];
            uVar16 = *(uint *)&pAVar3->field_0x14 >> 0xc;
            uVar7 = *(uint *)&pFanin->field_0x14 >> 0xc;
            if (uVar16 <= uVar7) {
              __assert_fail("Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                            ,0x98b,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
            }
            uVar16 = uVar16 - 1;
            if (uVar16 != uVar7) {
              pFaninNew = Abc_NtkAddBuffsOne(pVVar8,pFanin,uVar16,nLevelMax);
              Abc_ObjPatchFanin(pAVar3,pFanin,pFaninNew);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (pAVar3->vFanins).nSize);
        }
      }
      uVar9 = uVar9 + 1;
      pVVar11 = pNtk->vObjs;
    } while ((long)uVar9 < (long)pVVar11->nSize);
  }
  if (ppvVar10 != (void **)0x0) {
    free(ppvVar10);
    pVVar8->pArray = (void **)0x0;
  }
  free(pVVar8);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      puVar1 = (uint *)((long)pVVar8->pArray[lVar12] + 0x14);
      *puVar1 = *puVar1 & 0xfff;
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAddBuffsInt( Abc_Ntk_t * pNtkInit, int fReverse, int nImprove, int fVerbose )
{
    Vec_Ptr_t * vBuffs;
    Abc_Ntk_t * pNtk = Abc_NtkDup( pNtkInit );
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    int i, k, Iter, nLevelMax = Abc_NtkLevel( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = nLevelMax + 1;
    if ( fReverse )
    {
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        assert( nLevelMax < (1<<18) );
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObj->Level = (1<<18);
            Abc_ObjForEachFanout( pObj, pFanin, k )
                pObj->Level = Abc_MinInt( pFanin->Level - 1, pObj->Level );
            assert( pObj->Level > 0 );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->Level = 0;

        // move the nodes down one step at a time
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = -1;
                assert( pObj->Level > 0 );
                Abc_ObjForEachFanin( pObj, pFanin, k )
                {
                    assert( pFanin->Level < pObj->Level );
                    if ( pFanin->Level + 1 == pObj->Level )
                        break;
                }
                if ( k < Abc_ObjFaninNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain += Abc_NtkAddBuffsEval( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level--;
                    Counter++;
                    TotalGain += CountGain;
                }
            }
            if ( fVerbose )
                printf( "Shifted %5d nodes down with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    else
    {
        // move the nodes up one step at a time
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = 1;
                assert( pObj->Level <= (unsigned)nLevelMax );
                Abc_ObjForEachFanout( pObj, pFanin, k )
                {
                    assert( pFanin->Level > pObj->Level );
                    if ( pFanin->Level == pObj->Level + 1 )
                        break;
                }
                if ( k < Abc_ObjFanoutNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain -= !Abc_NtkAddBuffsEval2( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level++;
                    Counter++;
                    TotalGain += CountGain;
                }
            } 
            if ( fVerbose )
                printf( "Shifted %5d nodes up with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    vBuffs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) * (nLevelMax + 1) );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i == Vec_PtrSize(vBuffs) / (nLevelMax + 1) )
            break;
        if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsCo(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin) );
            if ( Abc_ObjLevel(pObj) - 1 == Abc_ObjLevel(pFanin) )
                continue;
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Abc_ObjLevel(pObj) - 1, nLevelMax );
            Abc_ObjPatchFanin( pObj, pFanin, pBuffer );
        }
    }
    Vec_PtrFree( vBuffs );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = 0;
    return pNtk;
}